

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::unclipped_blit
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,uint src_x,uint src_y,uint src_w,
          uint src_h,uint dst_x,uint dst_y,image<crnlib::color_quad<unsigned_char,_int>_> *src)

{
  bool bVar1;
  uint uVar2;
  uint local_48;
  uint i;
  uint bytes_to_copy;
  color_quad<unsigned_char,_int> *pD;
  color_quad<unsigned_char,_int> *pS;
  uint dst_x_local;
  uint src_h_local;
  uint src_w_local;
  uint src_y_local;
  uint src_x_local;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  bVar1 = is_valid(this);
  if ((bVar1) && (bVar1 = is_valid(src), bVar1)) {
    uVar2 = get_width(src);
    if ((uVar2 < src_x + src_w) || (uVar2 = get_height(src), uVar2 < src_y + src_h)) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = get_width(this);
      if ((uVar2 < dst_x + src_w) || (uVar2 = get_height(this), uVar2 < dst_y + src_h)) {
        this_local._7_1_ = false;
      }
      else {
        pD = operator()(src,src_x,src_y);
        _i = operator()(this,dst_x,dst_y);
        for (local_48 = src_h; local_48 != 0; local_48 = local_48 - 1) {
          memcpy(_i,pD,(ulong)(src_w << 2));
          uVar2 = get_pitch(src);
          pD = pD + uVar2;
          uVar2 = get_pitch(this);
          _i = _i + uVar2;
        }
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool unclipped_blit(uint src_x, uint src_y, uint src_w, uint src_h, uint dst_x, uint dst_y, const image& src)
        {
            if ((!is_valid()) || (!src.is_valid()))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (((src_x + src_w) > src.get_width()) || ((src_y + src_h) > src.get_height()))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (((dst_x + src_w) > get_width()) || ((dst_y + src_h) > get_height()))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            const color_type* pS = &src(src_x, src_y);
            color_type* pD = &(*this)(dst_x, dst_y);

            const uint bytes_to_copy = src_w * sizeof(color_type);
            for (uint i = src_h; i; i--)
            {
                memcpy(pD, pS, bytes_to_copy);

                pS += src.get_pitch();
                pD += get_pitch();
            }

            return true;
        }